

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>::int_writer<int,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
          *f)

{
  size_t n;
  ulong n_00;
  ulong uVar1;
  char_type fill;
  wchar_t local_34;
  type local_30;
  
  n_00 = (ulong)spec->width_;
  n = f->size_;
  uVar1 = n_00 - n;
  if (n_00 < n || uVar1 == 0) {
    local_30 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                         ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,n)
    ;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
                  *)f,&local_30);
  }
  else {
    local_30 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                         ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,
                          n_00);
    local_34 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      local_30 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_30,uVar1 >> 1,&local_34);
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
                    *)f,&local_30);
      uVar1 = uVar1 - (uVar1 >> 1);
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        local_30 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_30,uVar1,&local_34);
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
                      *)f,&local_30);
        return;
      }
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
                    *)f,&local_30);
    }
    std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_30,uVar1,&local_34);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }